

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::MergeFrom(ExtensionSet *this,ExtensionSet *other)

{
  ushort uVar1;
  long lVar2;
  _Rb_tree_node_base *p_Var3;
  difference_type dVar4;
  long lVar5;
  KeyValue *pKVar6;
  size_t minimum_new_capacity;
  KeyValue *pKVar7;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> it;
  KeyValue *it_1;
  KeyValue *pKVar8;
  KeyValue *pKVar9;
  
  if (0x100 < this->flat_capacity_) {
LAB_0023547d:
    pKVar9 = (other->map_).flat;
    if (other->flat_capacity_ < 0x101) {
      for (lVar2 = (ulong)other->flat_size_ << 5; lVar2 != 0; lVar2 = lVar2 + -0x20) {
        InternalExtensionMergeFrom(this,pKVar9->first,&pKVar9->second);
        pKVar9 = pKVar9 + 1;
      }
    }
    else {
      for (p_Var3 = (_Rb_tree_node_base *)(pKVar9->second).descriptor;
          p_Var3 != (_Rb_tree_node_base *)&pKVar9->second;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        InternalExtensionMergeFrom(this,p_Var3[1]._M_color,(Extension *)&p_Var3[1]._M_parent);
      }
    }
    return;
  }
  pKVar9 = (this->map_).flat;
  uVar1 = this->flat_size_;
  pKVar8 = (other->map_).flat;
  if (0x100 < other->flat_capacity_) {
    p_Var3 = (_Rb_tree_node_base *)(pKVar8->second).descriptor;
    lVar2 = 0;
    pKVar7 = pKVar9;
    do {
      lVar2 = -lVar2;
      lVar5 = (long)pKVar9 + ((ulong)uVar1 * 0x20 - (long)pKVar7);
      while( true ) {
        if ((pKVar7 == pKVar9 + uVar1) || (p_Var3 == (_Rb_tree_node_base *)&pKVar8->second)) {
          dVar4 = std::
                  __distance<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                            (p_Var3,&pKVar8->second);
          minimum_new_capacity = (dVar4 + (lVar5 >> 5)) - lVar2;
          goto LAB_00235475;
        }
        if ((int)p_Var3[1]._M_color <= pKVar7->first) break;
        pKVar7 = pKVar7 + 1;
        lVar2 = lVar2 + -1;
        lVar5 = lVar5 + -0x20;
      }
      lVar2 = 1 - lVar2;
      if (pKVar7->first == p_Var3[1]._M_color) {
        pKVar7 = pKVar7 + 1;
      }
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while( true );
  }
  pKVar6 = pKVar8 + other->flat_size_;
  lVar2 = 0;
  pKVar7 = pKVar9;
LAB_0023541d:
  lVar5 = (long)pKVar9 + ((ulong)uVar1 * 0x20 - (long)pKVar7);
  lVar2 = -lVar2;
  do {
    if ((pKVar7 == pKVar9 + uVar1) || (pKVar8 == pKVar6)) {
      minimum_new_capacity = (((long)pKVar6 - (long)pKVar8 >> 5) + (lVar5 >> 5)) - lVar2;
LAB_00235475:
      GrowCapacity(this,minimum_new_capacity);
      goto LAB_0023547d;
    }
    if (pKVar8->first <= pKVar7->first) break;
    pKVar7 = pKVar7 + 1;
    lVar5 = lVar5 + -0x20;
    lVar2 = lVar2 + -1;
  } while( true );
  if (pKVar7->first == pKVar8->first) {
    pKVar7 = pKVar7 + 1;
  }
  pKVar8 = pKVar8 + 1;
  lVar2 = 1 - lVar2;
  goto LAB_0023541d;
}

Assistant:

void ExtensionSet::MergeFrom(const ExtensionSet& other) {
  if (PROTOBUF_PREDICT_TRUE(!is_large())) {
    if (PROTOBUF_PREDICT_TRUE(!other.is_large())) {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(), other.flat_begin(),
                               other.flat_end()));
    } else {
      GrowCapacity(SizeOfUnion(flat_begin(), flat_end(),
                               other.map_.large->begin(),
                               other.map_.large->end()));
    }
  }
  other.ForEach([this](int number, const Extension& ext) {
    this->InternalExtensionMergeFrom(number, ext);
  });
}